

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.cpp
# Opt level: O1

bool duckdb::TryDecimalSubtract::Operation<short,short,short>
               (int16_t left,int16_t right,int16_t *result)

{
  undefined2 in_register_00000032;
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,left);
  if (right < 0) {
    if (iVar1 <= CONCAT22(in_register_00000032,right) + 9999) goto LAB_01447e1c;
  }
  else if (CONCAT22(in_register_00000032,right) + -9999 <= iVar1) {
LAB_01447e1c:
    *result = left - right;
    return true;
  }
  return false;
}

Assistant:

bool TryDecimalSubtractTemplated(T left, T right, T &result) {
	if (right < 0) {
		if (max + right < left) {
			return false;
		}
	} else {
		if (min + right > left) {
			return false;
		}
	}
	result = left - right;
	return true;
}